

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O0

void __thiscall
booster::aio::event_loop_impl::post(event_loop_impl *this,event_handler *h,error_code *e)

{
  unique_lock<std::recursive_mutex> *in_RDI;
  lock_guard l;
  value_type *in_stack_ffffffffffffff88;
  completion_handler *in_stack_ffffffffffffffa0;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            (in_RDI,(mutex_type *)in_stack_ffffffffffffff88);
  completion_handler::completion_handler
            (in_stack_ffffffffffffffa0,(event_handler *)&in_RDI[5]._M_owns,(error_code *)in_RDI);
  std::
  deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
  ::push_back((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
               *)in_RDI,in_stack_ffffffffffffff88);
  completion_handler::~completion_handler((completion_handler *)0x2073aa);
  if ((in_RDI[3].field_0xd & 1) != 0) {
    wake((event_loop_impl *)0x2073bf);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void post(event_handler const &h,booster::system::error_code const &e)
	{
		lock_guard l(data_mutex_);
		dispatch_queue_.push_back(completion_handler(h,e));
		if(polling_)
			wake();
	}